

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ripser.cc
# Opt level: O0

int main(int argc,char **argv)

{
  pointer *this;
  char *pcVar1;
  int iVar2;
  vertex_t vVar3;
  size_t sVar4;
  undefined8 uVar5;
  bool bVar6;
  byte bVar7;
  vertex_t vVar8;
  vertex_t vVar9;
  vertex_t vVar10;
  vertex_t vVar11;
  size_t sVar12;
  ostream *poVar13;
  float *pfVar14;
  reference pfVar15;
  long lVar16;
  anon_class_4_1_a88e3f2b *in_R9;
  float fVar17;
  float fVar18;
  istream *local_648;
  istream *local_638;
  istream *local_5d8;
  Sparse_distance_matrix<Params> local_4d0;
  Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0> local_4b0;
  float local_47c;
  iterator iStack_478;
  float d;
  iterator __end3;
  iterator __begin3;
  vector<float,_std::allocator<float>_> *__range3;
  int local_458;
  float local_454;
  vertex_t j;
  value_t r_i;
  vertex_t i_1;
  value_t enclosing_radius;
  size_t num_edges;
  float local_438;
  value_t max_finite;
  value_t max;
  value_t min;
  Compressed_lower_distance_matrix dist_2;
  Euclidean_distance_matrix local_3e0;
  undefined1 local_3c8 [8];
  Sparse_distance_matrix dist_1;
  undefined1 local_388 [8];
  Sparse_distance_matrix dist;
  anon_class_4_1_a88e3f2b output_pair;
  anon_class_1_0_00000001 output_dim;
  ifstream file_stream;
  size_t local_158;
  size_t next_pos_3;
  undefined1 local_148 [8];
  string parameter_4;
  undefined1 local_120 [8];
  string parameter_3;
  size_t next_pos_2;
  undefined1 local_f0 [8];
  string parameter_2;
  size_t next_pos_1;
  undefined1 local_c0 [8];
  string parameter_1;
  size_t next_pos;
  undefined1 local_90 [8];
  string parameter;
  allocator<char> local_59;
  undefined1 local_58 [8];
  string arg;
  int i;
  coefficient_t modulus;
  float ratio;
  value_t threshold;
  dimension_t dim_max;
  char *pcStack_20;
  file_format format;
  char *filename;
  char **argv_local;
  int argc_local;
  
  pcStack_20 = (char *)0x0;
  threshold = 2.8026e-45;
  ratio._3_1_ = '\x01';
  modulus = (coefficient_t)std::numeric_limits<float>::max();
  i = 0x3f800000;
  arg.field_2._12_4_ = 2;
  for (arg.field_2._8_4_ = 1; (int)arg.field_2._8_4_ < argc;
      arg.field_2._8_4_ = arg.field_2._8_4_ + 1) {
    pcVar1 = argv[(int)arg.field_2._8_4_];
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_58,pcVar1,&local_59);
    std::allocator<char>::~allocator(&local_59);
    bVar6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_58,"--help");
    if (bVar6) {
      print_usage_and_exit(0);
    }
    else {
      bVar6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_58,"--dim");
      if (bVar6) {
        lVar16 = (long)(int)arg.field_2._8_4_;
        arg.field_2._8_4_ = arg.field_2._8_4_ + 1;
        pcVar1 = argv[lVar16 + 1];
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_90,pcVar1,(allocator<char> *)((long)&next_pos + 7));
        std::allocator<char>::~allocator((allocator<char> *)((long)&next_pos + 7));
        lVar16 = std::__cxx11::stol((string *)local_90,
                                    (size_t *)(parameter_1.field_2._M_local_buf + 8),10);
        uVar5 = parameter_1.field_2._8_8_;
        ratio._3_1_ = (char)lVar16;
        lVar16 = std::__cxx11::string::size();
        if (uVar5 != lVar16) {
          print_usage_and_exit(-1);
        }
        std::__cxx11::string::~string((string *)local_90);
      }
      else {
        bVar6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_58,"--threshold");
        if (bVar6) {
          lVar16 = (long)(int)arg.field_2._8_4_;
          arg.field_2._8_4_ = arg.field_2._8_4_ + 1;
          pcVar1 = argv[lVar16 + 1];
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_c0,pcVar1,(allocator<char> *)((long)&next_pos_1 + 7));
          std::allocator<char>::~allocator((allocator<char> *)((long)&next_pos_1 + 7));
          modulus = (coefficient_t)
                    std::__cxx11::stof((string *)local_c0,
                                       (size_t *)(parameter_2.field_2._M_local_buf + 8));
          uVar5 = parameter_2.field_2._8_8_;
          lVar16 = std::__cxx11::string::size();
          if (uVar5 != lVar16) {
            print_usage_and_exit(-1);
          }
          std::__cxx11::string::~string((string *)local_c0);
        }
        else {
          bVar6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_58,"--ratio");
          if (bVar6) {
            lVar16 = (long)(int)arg.field_2._8_4_;
            arg.field_2._8_4_ = arg.field_2._8_4_ + 1;
            pcVar1 = argv[lVar16 + 1];
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)local_f0,pcVar1,(allocator<char> *)((long)&next_pos_2 + 7));
            std::allocator<char>::~allocator((allocator<char> *)((long)&next_pos_2 + 7));
            i = (int)std::__cxx11::stof((string *)local_f0,
                                        (size_t *)(parameter_3.field_2._M_local_buf + 8));
            uVar5 = parameter_3.field_2._8_8_;
            lVar16 = std::__cxx11::string::size();
            if (uVar5 != lVar16) {
              print_usage_and_exit(-1);
            }
            std::__cxx11::string::~string((string *)local_f0);
          }
          else {
            bVar6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_58,"--format");
            if (bVar6) {
              lVar16 = (long)(int)arg.field_2._8_4_;
              arg.field_2._8_4_ = arg.field_2._8_4_ + 1;
              pcVar1 = argv[lVar16 + 1];
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)local_120,pcVar1,
                         (allocator<char> *)(parameter_4.field_2._M_local_buf + 0xf));
              std::allocator<char>::~allocator
                        ((allocator<char> *)(parameter_4.field_2._M_local_buf + 0xf));
              lVar16 = std::__cxx11::string::rfind(local_120,0x1ad5db);
              if (lVar16 == 0) {
                threshold = 0.0;
              }
              else {
                lVar16 = std::__cxx11::string::rfind(local_120,0x1ad5e1);
                if (lVar16 == 0) {
                  threshold = 1.4013e-45;
                }
                else {
                  lVar16 = std::__cxx11::string::rfind(local_120,0x1ad5e7);
                  if (lVar16 == 0) {
                    threshold = 2.8026e-45;
                  }
                  else {
                    lVar16 = std::__cxx11::string::rfind(local_120,0x1ad5ec);
                    if (lVar16 == 0) {
                      threshold = 4.2039e-45;
                    }
                    else {
                      bVar6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)local_120,"dipha");
                      if (bVar6) {
                        threshold = 5.60519e-45;
                      }
                      else {
                        bVar6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                 *)local_120,"sparse");
                        if (bVar6) {
                          threshold = 7.00649e-45;
                        }
                        else {
                          bVar6 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_120,"binary");
                          if (bVar6) {
                            threshold = 8.40779e-45;
                          }
                          else {
                            print_usage_and_exit(-1);
                          }
                        }
                      }
                    }
                  }
                }
              }
              std::__cxx11::string::~string((string *)local_120);
            }
            else {
              bVar6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_58,"--modulus");
              if (bVar6) {
                lVar16 = (long)(int)arg.field_2._8_4_;
                arg.field_2._8_4_ = arg.field_2._8_4_ + 1;
                pcVar1 = argv[lVar16 + 1];
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)local_148,pcVar1,(allocator<char> *)((long)&next_pos_3 + 7));
                std::allocator<char>::~allocator((allocator<char> *)((long)&next_pos_3 + 7));
                lVar16 = std::__cxx11::stol((string *)local_148,&local_158,10);
                sVar4 = local_158;
                arg.field_2._12_4_ = (undefined4)lVar16;
                sVar12 = std::__cxx11::string::size();
                if ((sVar4 != sVar12) ||
                   (bVar6 = Gudhi::ripser::is_prime<unsigned_int>(arg.field_2._12_4_), !bVar6)) {
                  print_usage_and_exit(-1);
                }
                std::__cxx11::string::~string((string *)local_148);
              }
              else {
                if (pcStack_20 != (char *)0x0) {
                  print_usage_and_exit(-1);
                }
                pcStack_20 = argv[(int)arg.field_2._8_4_];
              }
            }
          }
        }
      }
    }
    std::__cxx11::string::~string((string *)local_58);
  }
  std::ifstream::ifstream(&output_pair,pcStack_20,8);
  if ((pcStack_20 != (char *)0x0) && (bVar7 = std::ios::fail(), (bVar7 & 1) != 0)) {
    poVar13 = std::operator<<((ostream *)&std::cerr,"couldn\'t open file ");
    poVar13 = std::operator<<(poVar13,pcStack_20);
    std::ostream::operator<<(poVar13,std::endl<char,std::char_traits<char>>);
    exit(-1);
  }
  dist.num_edges._0_4_ = i;
  if (threshold == 7.00649e-45) {
    if (pcStack_20 == (char *)0x0) {
      local_5d8 = (istream *)&std::cin;
    }
    else {
      local_5d8 = (istream *)&output_pair;
    }
    read_sparse_distance_matrix((Sparse_distance_matrix *)local_388,local_5d8);
    poVar13 = std::operator<<((ostream *)&std::cout,"sparse distance matrix with ");
    vVar8 = Gudhi::ripser::Sparse_distance_matrix<Params>::size
                      ((Sparse_distance_matrix<Params> *)local_388);
    poVar13 = (ostream *)std::ostream::operator<<(poVar13,vVar8);
    poVar13 = std::operator<<(poVar13," points and ");
    poVar13 = (ostream *)
              std::ostream::operator<<
                        (poVar13,(ulong)dist.neighbors.
                                        super__Vector_base<std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>,_std::allocator<std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    poVar13 = std::operator<<(poVar13,"/");
    vVar8 = Gudhi::ripser::Sparse_distance_matrix<Params>::size
                      ((Sparse_distance_matrix<Params> *)local_388);
    vVar9 = Gudhi::ripser::Sparse_distance_matrix<Params>::size
                      ((Sparse_distance_matrix<Params> *)local_388);
    poVar13 = (ostream *)std::ostream::operator<<(poVar13,(vVar8 * (vVar9 + -1)) / 2);
    poVar13 = std::operator<<(poVar13," entries");
    std::ostream::operator<<(poVar13,std::endl<char,std::char_traits<char>>);
    Gudhi::ripser::Sparse_distance_matrix<Params>::Sparse_distance_matrix
              ((Sparse_distance_matrix<Params> *)&dist_1.num_edges,
               (Sparse_distance_matrix<Params> *)local_388);
    Gudhi::ripser::ripser<Gudhi::ripser::Sparse_distance_matrix<Params>,main::__0&,main::__1&>
              ((ripser *)&dist_1.num_edges,
               (Sparse_distance_matrix<Params> *)(ulong)(uint)(int)ratio._3_1_,arg.field_2._12_4_,
               (value_t)modulus,(int)&dist + 0x1f,(anon_class_1_0_00000001 *)&dist.num_edges,in_R9);
    Gudhi::ripser::Sparse_distance_matrix<Params>::~Sparse_distance_matrix
              ((Sparse_distance_matrix<Params> *)&dist_1.num_edges);
    Gudhi::ripser::Sparse_distance_matrix<Params>::~Sparse_distance_matrix
              ((Sparse_distance_matrix<Params> *)local_388);
  }
  else if ((threshold != 4.2039e-45) ||
          (fVar17 = std::numeric_limits<float>::max(), fVar17 <= (float)modulus)) {
    if (pcStack_20 == (char *)0x0) {
      local_648 = (istream *)&std::cin;
    }
    else {
      local_648 = (istream *)&output_pair;
    }
    read_file((Compressed_lower_distance_matrix *)&max,local_648,(file_format)threshold);
    max_finite = std::numeric_limits<float>::infinity();
    fVar17 = std::numeric_limits<float>::infinity();
    num_edges._4_4_ = -fVar17;
    _i_1 = 0;
    local_438 = num_edges._4_4_;
    r_i = std::numeric_limits<float>::infinity();
    fVar17 = std::numeric_limits<float>::max();
    if (fVar17 <= (float)modulus) {
      for (j = 0; vVar3 = j,
          vVar10 = Gudhi::ripser::
                   Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>::
                   size((Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>
                         *)&max), vVar3 < vVar10; j = j + 1) {
        local_454 = std::numeric_limits<float>::infinity();
        local_454 = -local_454;
        for (local_458 = 0; iVar2 = local_458,
            vVar10 = Gudhi::ripser::
                     Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>
                     ::size((Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>
                             *)&max), iVar2 < vVar10; local_458 = local_458 + 1) {
          __range3._4_4_ =
               Gudhi::ripser::
               Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>::
               operator()((Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>
                           *)&max,j,local_458);
          pfVar14 = std::max<float>(&local_454,(float *)((long)&__range3 + 4));
          local_454 = *pfVar14;
        }
        pfVar14 = std::min<float>(&r_i,&local_454);
        r_i = *pfVar14;
      }
    }
    __end3 = std::vector<float,_std::allocator<float>_>::begin
                       ((vector<float,_std::allocator<float>_> *)&max);
    iStack_478 = std::vector<float,_std::allocator<float>_>::end
                           ((vector<float,_std::allocator<float>_> *)&max);
    while (bVar6 = __gnu_cxx::operator!=(&__end3,&stack0xfffffffffffffb88), bVar6) {
      pfVar15 = __gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>::
                operator*(&__end3);
      local_47c = *pfVar15;
      pfVar14 = std::min<float>(&max_finite,&local_47c);
      max_finite = *pfVar14;
      pfVar14 = std::max<float>(&local_438,&local_47c);
      fVar17 = local_47c;
      local_438 = *pfVar14;
      fVar18 = std::numeric_limits<float>::infinity();
      if ((fVar17 != fVar18) || (NAN(fVar17) || NAN(fVar18))) {
        pfVar14 = std::max<float>((float *)((long)&num_edges + 4),&local_47c);
        num_edges._4_4_ = *pfVar14;
      }
      if (local_47c <= (float)modulus) {
        _i_1 = _i_1 + 1;
      }
      __gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>::operator++
                (&__end3);
    }
    poVar13 = std::operator<<((ostream *)&std::cout,"value range: [");
    poVar13 = (ostream *)std::ostream::operator<<(poVar13,max_finite);
    poVar13 = std::operator<<(poVar13,",");
    poVar13 = (ostream *)std::ostream::operator<<(poVar13,num_edges._4_4_);
    poVar13 = std::operator<<(poVar13,"]");
    std::ostream::operator<<(poVar13,std::endl<char,std::char_traits<char>>);
    fVar17 = std::numeric_limits<float>::max();
    if ((float)modulus < fVar17) {
      poVar13 = std::operator<<((ostream *)&std::cout,"sparse distance matrix with ");
      vVar10 = Gudhi::ripser::
               Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>::size
                         ((Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>
                           *)&max);
      poVar13 = (ostream *)std::ostream::operator<<(poVar13,vVar10);
      poVar13 = std::operator<<(poVar13," points and ");
      poVar13 = (ostream *)std::ostream::operator<<(poVar13,_i_1);
      poVar13 = std::operator<<(poVar13,"/");
      vVar10 = Gudhi::ripser::
               Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>::size
                         ((Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>
                           *)&max);
      vVar11 = Gudhi::ripser::
               Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>::size
                         ((Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>
                           *)&max);
      poVar13 = (ostream *)std::ostream::operator<<(poVar13,(vVar10 * (vVar11 + -1)) / 2);
      poVar13 = std::operator<<(poVar13," entries");
      std::ostream::operator<<(poVar13,std::endl<char,std::char_traits<char>>);
      Gudhi::ripser::Sparse_distance_matrix<Params>::
      Sparse_distance_matrix<Gudhi::ripser::Compressed_distance_matrix<Params,(Gudhi::ripser::Compressed_matrix_layout)0>>
                (&local_4d0,
                 (Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0> *)
                 &max,(value_t)modulus);
      Gudhi::ripser::ripser<Gudhi::ripser::Sparse_distance_matrix<Params>,main::__0&,main::__1&>
                ((ripser *)&local_4d0,
                 (Sparse_distance_matrix<Params> *)(ulong)(uint)(int)ratio._3_1_,arg.field_2._12_4_,
                 (value_t)modulus,(int)&dist + 0x1f,(anon_class_1_0_00000001 *)&dist.num_edges,in_R9
                );
      Gudhi::ripser::Sparse_distance_matrix<Params>::~Sparse_distance_matrix(&local_4d0);
    }
    else {
      poVar13 = std::operator<<((ostream *)&std::cout,"distance matrix with ");
      vVar10 = Gudhi::ripser::
               Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>::size
                         ((Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>
                           *)&max);
      poVar13 = (ostream *)std::ostream::operator<<(poVar13,vVar10);
      poVar13 = std::operator<<(poVar13," points, using threshold at enclosing radius ");
      poVar13 = (ostream *)std::ostream::operator<<(poVar13,r_i);
      std::ostream::operator<<(poVar13,std::endl<char,std::char_traits<char>>);
      Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>
      ::Compressed_distance_matrix
                (&local_4b0,
                 (Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0> *)
                 &max);
      Gudhi::ripser::
      ripser<Gudhi::ripser::Compressed_distance_matrix<Params,(Gudhi::ripser::Compressed_matrix_layout)0>,main::__0&,main::__1&>
                ((ripser *)&local_4b0,
                 (Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0> *)
                 (ulong)(uint)(int)ratio._3_1_,arg.field_2._12_4_,r_i,(int)&dist + 0x1f,
                 (anon_class_1_0_00000001 *)&dist.num_edges,in_R9);
      Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>
      ::~Compressed_distance_matrix(&local_4b0);
    }
    Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>::
    ~Compressed_distance_matrix
              ((Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0> *)
               &max);
  }
  else {
    if (pcStack_20 == (char *)0x0) {
      local_638 = (istream *)&std::cin;
    }
    else {
      local_638 = (istream *)&output_pair;
    }
    read_point_cloud(&local_3e0,local_638);
    Gudhi::ripser::Sparse_distance_matrix<Params>::
    Sparse_distance_matrix<Gudhi::ripser::Euclidean_distance_matrix<Params>>
              ((Sparse_distance_matrix<Params> *)local_3c8,&local_3e0,(value_t)modulus);
    Gudhi::ripser::Euclidean_distance_matrix<Params>::~Euclidean_distance_matrix(&local_3e0);
    this = &dist_2.rows.super__Vector_base<float_*,_std::allocator<float_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage;
    Gudhi::ripser::Sparse_distance_matrix<Params>::Sparse_distance_matrix
              ((Sparse_distance_matrix<Params> *)this,(Sparse_distance_matrix<Params> *)local_3c8);
    Gudhi::ripser::ripser<Gudhi::ripser::Sparse_distance_matrix<Params>,main::__0&,main::__1&>
              ((ripser *)this,(Sparse_distance_matrix<Params> *)(ulong)(uint)(int)ratio._3_1_,
               arg.field_2._12_4_,(value_t)modulus,(int)&dist + 0x1f,
               (anon_class_1_0_00000001 *)&dist.num_edges,in_R9);
    Gudhi::ripser::Sparse_distance_matrix<Params>::~Sparse_distance_matrix
              ((Sparse_distance_matrix<Params> *)
               &dist_2.rows.super__Vector_base<float_*,_std::allocator<float_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    Gudhi::ripser::Sparse_distance_matrix<Params>::~Sparse_distance_matrix
              ((Sparse_distance_matrix<Params> *)local_3c8);
  }
  std::ifstream::~ifstream(&output_pair);
  return 0;
}

Assistant:

int main(int argc, char** argv) {
  const char* filename = nullptr;

  file_format format = DISTANCE_MATRIX;

  dimension_t dim_max = 1;
  value_t threshold = std::numeric_limits<value_t>::max();
  float ratio = 1;
  coefficient_t modulus = 2;

  for (int i = 1; i < argc; ++i) {
    const std::string arg(argv[i]);
    if (arg == "--help") {
      print_usage_and_exit(0);
    } else if (arg == "--dim") {
      std::string parameter = std::string(argv[++i]);
      std::size_t next_pos;
      dim_max = std::stol(parameter, &next_pos);
      if (next_pos != parameter.size()) print_usage_and_exit(-1);
    } else if (arg == "--threshold") {
      std::string parameter = std::string(argv[++i]);
      std::size_t next_pos;
      threshold = std::stof(parameter, &next_pos);
      if (next_pos != parameter.size()) print_usage_and_exit(-1);
    } else if (arg == "--ratio") {
      std::string parameter = std::string(argv[++i]);
      std::size_t next_pos;
      ratio = std::stof(parameter, &next_pos);
      if (next_pos != parameter.size()) print_usage_and_exit(-1);
    } else if (arg == "--format") {
      std::string parameter = std::string(argv[++i]);
      if (parameter.rfind("lower", 0) == 0)
        format = LOWER_DISTANCE_MATRIX;
      else if (parameter.rfind("upper", 0) == 0)
        format = UPPER_DISTANCE_MATRIX;
      else if (parameter.rfind("dist", 0) == 0)
        format = DISTANCE_MATRIX;
      else if (parameter.rfind("point", 0) == 0)
        format = POINT_CLOUD;
      else if (parameter == "dipha")
        format = DIPHA;
      else if (parameter == "sparse")
        format = SPARSE;
      else if (parameter == "binary")
        format = BINARY;
      else
        print_usage_and_exit(-1);
    } else if (arg == "--modulus") {
      std::string parameter = std::string(argv[++i]);
      std::size_t next_pos;
      modulus = std::stol(parameter, &next_pos);
      if (next_pos != parameter.size() || !Gudhi::ripser::is_prime(modulus)) print_usage_and_exit(-1);
    } else {
      if (filename) { print_usage_and_exit(-1); }
      filename = argv[i];
    }
  }

  std::ifstream file_stream(filename);
  if (filename && file_stream.fail()) {
    std::cerr << "couldn't open file " << filename << std::endl;
    exit(-1);
  }

  auto output_dim = [](dimension_t dim) {
    std::cout << "persistence intervals in dim " << (int)dim << ":" << std::endl;
  };
  auto output_pair = [ratio](value_t birth, value_t death) {
#ifdef GUDHI_INDICATE_PROGRESS
    // Not necessary if we redirect stdout
    std::cerr << Gudhi::ripser::clear_line << std::flush;
#endif
    if (death == std::numeric_limits<value_t>::infinity())
      std::cout << " [" << birth << ", )" << std::endl;
    else if (death > birth * ratio)
      std::cout << " [" << birth << "," << death << ")" << std::endl;
  };
  if (format == SPARSE) {
    Sparse_distance_matrix dist =
      read_sparse_distance_matrix(filename ? file_stream : std::cin);
    std::cout << "sparse distance matrix with " << dist.size() << " points and "
      << dist.num_edges << "/" << (dist.size() * (dist.size() - 1)) / 2 << " entries"
      << std::endl;

    ripser(std::move(dist), dim_max, threshold, modulus, output_dim, output_pair);
  } else if (format == POINT_CLOUD && threshold < std::numeric_limits<value_t>::max()) {
    Sparse_distance_matrix dist(read_point_cloud(filename ? file_stream : std::cin), threshold);
    ripser(std::move(dist), dim_max, threshold, modulus, output_dim, output_pair);
  } else {
    Compressed_lower_distance_matrix dist =
      read_file(filename ? file_stream : std::cin, format);

    value_t min = std::numeric_limits<value_t>::infinity(),
            max = -std::numeric_limits<value_t>::infinity(), max_finite = max;
    std::size_t num_edges = 0;

    value_t enclosing_radius = std::numeric_limits<value_t>::infinity();
    if (threshold >= std::numeric_limits<value_t>::max()) {
      for (vertex_t i = 0; i < dist.size(); ++i) {
        value_t r_i = -std::numeric_limits<value_t>::infinity();
        for (vertex_t j = 0; j < dist.size(); ++j) r_i = std::max(r_i, dist(i, j));
        enclosing_radius = std::min(enclosing_radius, r_i);
      }
    }

    for (auto d : dist.distances) {
      min = std::min(min, d);
      max = std::max(max, d);
      if (d != std::numeric_limits<value_t>::infinity()) max_finite = std::max(max_finite, d);
      if (d <= threshold) ++num_edges;
    }
    std::cout << "value range: [" << min << "," << max_finite << "]" << std::endl;

    if (threshold >= std::numeric_limits<value_t>::max()) {
      std::cout << "distance matrix with " << dist.size()
        << " points, using threshold at enclosing radius " << enclosing_radius
        << std::endl;
      ripser(std::move(dist), dim_max, enclosing_radius, modulus, output_dim, output_pair);
    } else {
      std::cout << "sparse distance matrix with " << dist.size() << " points and "
        << num_edges << "/" << (dist.size() * (dist.size() - 1)) / 2 << " entries"
        << std::endl;

      ripser(Sparse_distance_matrix(std::move(dist), threshold), dim_max, threshold, modulus, output_dim, output_pair);
    }
  }
  return 0;
}